

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateFieldInitializers
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  uint uVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  OneofDescriptor *in_RDX;
  OneofDescriptor *extraout_RDX;
  OneofDescriptor *extraout_RDX_00;
  OneofDescriptor *extraout_RDX_01;
  OneofDescriptor *extraout_RDX_02;
  OneofDescriptor *extraout_RDX_03;
  javanano *this_00;
  uint uVar5;
  long lVar6;
  long lVar7;
  string local_50;
  
  iVar1 = (this->field_generators_).total_bits_;
  if (0 < iVar1) {
    uVar2 = iVar1 + 0x1fU >> 5;
    uVar5 = 1;
    if (1 < uVar2) {
      uVar5 = uVar2;
    }
    this_00 = (javanano *)0x0;
    do {
      GetBitFieldName_abi_cxx11_(&local_50,this_00,(int)in_RDX);
      io::Printer::Print(printer,"$bit_field_name$ = 0;\n","bit_field_name",&local_50);
      in_RDX = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_00;
      }
      uVar2 = (int)this_00 + 1;
      this_00 = (javanano *)(ulong)uVar2;
    } while (uVar5 != uVar2);
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar6));
      (*pFVar3->_vptr_FieldGenerator[5])(pFVar3,printer);
      lVar7 = lVar7 + 1;
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 0xa8;
      in_RDX = extraout_RDX_01;
    } while (lVar7 < *(int *)(pDVar4 + 0x2c));
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x38)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      UnderscoresToCapitalizedCamelCase_abi_cxx11_
                (&local_50,(javanano *)(*(long *)(pDVar4 + 0x40) + lVar6),in_RDX);
      io::Printer::Print(printer,"clear$oneof_capitalized_name$();\n","oneof_capitalized_name",
                         &local_50);
      in_RDX = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_03;
      }
      lVar7 = lVar7 + 1;
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 0x30;
    } while (lVar7 < *(int *)(pDVar4 + 0x38));
  }
  if (this->params_->store_unknown_fields_ != false) {
    io::Printer::Print(printer,"unknownFieldData = null;\n");
  }
  io::Printer::Print(printer,"cachedSize = -1;\n");
  return;
}

Assistant:

void MessageGenerator::GenerateFieldInitializers(io::Printer* printer) {
  // Clear bit fields.
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Call clear for all of the fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateClearCode(printer);
  }

  // Clear oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "clear$oneof_capitalized_name$();\n",
      "oneof_capitalized_name", UnderscoresToCapitalizedCamelCase(
          descriptor_->oneof_decl(i)));
  }

  // Clear unknown fields.
  if (params_.store_unknown_fields()) {
    printer->Print("unknownFieldData = null;\n");
  }
  printer->Print("cachedSize = -1;\n");
}